

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asm_writer.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_10a01::AsmWriteWLADX::writeCommentHelper
          (AsmWriteWLADX *this,int start_pos,int target_column,string *comment)

{
  size_type sVar1;
  size_t i;
  ulong uVar2;
  undefined1 in_R8B;
  int __c;
  bool bVar3;
  
  sVar1 = comment->_M_string_length;
  if (sVar1 != 0) {
    bVar3 = true;
    for (uVar2 = 0; uVar2 < sVar1; uVar2 = uVar2 + 1) {
      if (bVar3) {
        start_pos = indent_column((AsmWriteWLADX *)this->m_outFile,
                                  (FILE *)(ulong)(uint)target_column,start_pos,1,(bool)in_R8B);
      }
      __c = (int)(comment->_M_dataplus)._M_p[uVar2];
      fputc(__c,(FILE *)this->m_outFile);
      bVar3 = __c == 10;
      if (bVar3) {
        start_pos = 0;
      }
      sVar1 = comment->_M_string_length;
    }
  }
  fputc(10,(FILE *)this->m_outFile);
  return;
}

Assistant:

void writeCommentHelper(const int start_pos, const int target_column, const std::string &comment) {

		if (comment.empty()) {
			fputc('\n', m_outFile);
			return;
		}

		int nw = start_pos;

		bool line_start = true;
		for (size_t i=0; i<comment.length(); ++i) {
			if (line_start) {
				nw = indent_column(m_outFile, target_column, nw, true);
				line_start = false;
			}
			char c = comment[i];
			fputc(c, m_outFile);
			if (c == '\n') {
				line_start = true;
				nw = 0;
			}
		}
		fputc('\n', m_outFile);
	}